

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp_uint_t sexp_bignum_hi(sexp a)

{
  long lVar1;
  sexp_uint_t sVar2;
  sexp_uint_t sVar3;
  
  sVar3 = (a->value).string.offset;
  do {
    sVar2 = sVar3;
    if (sVar3 == 1) {
      return sVar2;
    }
    lVar1 = sVar3 * 8;
    sVar3 = sVar3 - 1;
  } while (*(long *)((long)&a->value + lVar1 + 8) == 0);
  return sVar2;
}

Assistant:

sexp_uint_t sexp_bignum_hi (sexp a) {
  sexp_uint_t i=sexp_bignum_length(a)-1;
  while ((i>0) && ! sexp_bignum_data(a)[i])
    i--;
  return i+1;
}